

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Compiler::CombinedImageSamplerUsageHandler::handle
          (CombinedImageSamplerUsageHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  uint32_t id;
  uint32_t id_00;
  SPIRType *pSVar1;
  size_type sVar2;
  __hashtable *__h;
  uint32_t result_id;
  __node_gen_type __node_gen;
  uint32_t local_34;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_30;
  
  if (2 < opcode - OpAccessChain) {
    if (opcode == OpSampledImage) {
      if (length < 4) {
        return false;
      }
      local_34 = args[1];
      id = args[2];
      id_00 = args[3];
      sVar2 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&this->dref_combined_samplers->_M_h,&local_34);
      if (sVar2 != 0) {
        add_hierarchy_to_comparison_ids(this,id);
        add_hierarchy_to_comparison_ids(this,id_00);
        local_30 = &this->comparison_ids;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_30,&local_34);
        return true;
      }
      return true;
    }
    if (opcode != OpLoad) {
      return true;
    }
  }
  if (length < 3) {
    return false;
  }
  add_dependency(this,args[1],args[2]);
  pSVar1 = Variant::get<spirv_cross::SPIRType>
                     ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + *args);
  if (((pSVar1->image).dim == DimSubpassData) &&
     (this->need_subpass_input = true, (pSVar1->image).ms == true)) {
    this->need_subpass_input_ms = true;
  }
  sVar2 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&this->dref_combined_samplers->_M_h,args + 1);
  if (sVar2 != 0) {
    add_hierarchy_to_comparison_ids(this,args[1]);
    return true;
  }
  return true;
}

Assistant:

bool Compiler::CombinedImageSamplerUsageHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	switch (opcode)
	{
	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	case OpLoad:
	{
		if (length < 3)
			return false;

		add_dependency(args[1], args[2]);

		// Ideally defer this to OpImageRead, but then we'd need to track loaded IDs.
		// If we load an image, we're going to use it and there is little harm in declaring an unused gl_FragCoord.
		auto &type = compiler.get<SPIRType>(args[0]);
		if (type.image.dim == DimSubpassData)
		{
			need_subpass_input = true;
			if (type.image.ms)
				need_subpass_input_ms = true;
		}

		// If we load a SampledImage and it will be used with Dref, propagate the state up.
		if (dref_combined_samplers.count(args[1]) != 0)
			add_hierarchy_to_comparison_ids(args[1]);
		break;
	}

	case OpSampledImage:
	{
		if (length < 4)
			return false;

		// If the underlying resource has been used for comparison then duplicate loads of that resource must be too.
		// This image must be a depth image.
		uint32_t result_id = args[1];
		uint32_t image = args[2];
		uint32_t sampler = args[3];

		if (dref_combined_samplers.count(result_id) != 0)
		{
			add_hierarchy_to_comparison_ids(image);

			// This sampler must be a SamplerComparisonState, and not a regular SamplerState.
			add_hierarchy_to_comparison_ids(sampler);

			// Mark the OpSampledImage itself as being comparison state.
			comparison_ids.insert(result_id);
		}
		return true;
	}

	default:
		break;
	}

	return true;
}